

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

void __thiscall Color::blend(Color *this,Color *other)

{
  bool bVar1;
  Color local_1c;
  Color *pCStack_18;
  Color c;
  Color *other_local;
  Color *this_local;
  
  pCStack_18 = other;
  bVar1 = nontrivial(other);
  if (bVar1) {
    Color(&local_1c,pCStack_18);
    this->_value = local_1c._value & 0x40000 | this->_value;
    this->_value = local_1c._value & 0x400000 | this->_value;
    if (((this->_value & 0x200000) == 0) && ((local_1c._value & 0x200000) == 0)) {
      this->_value = local_1c._value & 0x20000 | this->_value;
      this->_value = local_1c._value & 0x10000 | this->_value;
      if ((local_1c._value & 0x80000) != 0) {
        this->_value = this->_value | 0x80000;
        this->_value = this->_value & 0xffffff00;
        this->_value = local_1c._value & 0xff | this->_value;
      }
      if ((local_1c._value & 0x100000) != 0) {
        this->_value = this->_value | 0x100000;
        this->_value = this->_value & 0xffff00ff;
        this->_value = local_1c._value & 0xff00 | this->_value;
      }
    }
    else {
      if ((this->_value & 0x200000) == 0) {
        upgrade(this);
      }
      if ((local_1c._value & 0x200000) == 0) {
        upgrade(&local_1c);
      }
      if ((local_1c._value & 0x80000) != 0) {
        this->_value = this->_value | 0x80000;
        this->_value = this->_value & 0xffffff00;
        this->_value = local_1c._value & 0xff | this->_value;
      }
      if ((local_1c._value & 0x100000) != 0) {
        this->_value = this->_value | 0x100000;
        this->_value = this->_value & 0xffff00ff;
        this->_value = local_1c._value & 0xff00 | this->_value;
      }
    }
    ~Color(&local_1c);
  }
  return;
}

Assistant:

void Color::blend (const Color& other)
{
#ifdef FEATURE_COLOR
  if (!other.nontrivial ())
    return;

  Color c (other);
  _value |= (c._value & _COLOR_UNDERLINE);    // Always inherit underline.
  _value |= (c._value & _COLOR_INVERSE);      // Always inherit inverse.

  // 16 <-- 16.
  if (!(_value   & _COLOR_256) &&
      !(c._value & _COLOR_256))
  {
    _value |= (c._value & _COLOR_BOLD);       // Inherit bold.
    _value |= (c._value & _COLOR_BRIGHT);     // Inherit bright.

    if (c._value & _COLOR_HASFG)
    {
      _value |= _COLOR_HASFG;                 // There is now a color.
      _value &= ~_COLOR_FG;                   // Remove previous color.
      _value |= (c._value & _COLOR_FG);       // Apply other color.
    }

    if (c._value & _COLOR_HASBG)
    {
      _value |= _COLOR_HASBG;                 // There is now a color.
      _value &= ~_COLOR_BG;                   // Remove previous color.
      _value |= (c._value & _COLOR_BG);       // Apply other color.
    }

    return;
  }
  else
  {
    // Upgrade either color, if necessary.
    if (!(_value   & _COLOR_256)) upgrade ();
    if (!(c._value & _COLOR_256)) c.upgrade ();

    // 256 <-- 256.
    if (c._value & _COLOR_HASFG)
    {
      _value |= _COLOR_HASFG;                  // There is now a color.
      _value &= ~_COLOR_FG;                    // Remove previous color.
      _value |= (c._value & _COLOR_FG);        // Apply other color.
    }

    if (c._value & _COLOR_HASBG)
    {
      _value |= _COLOR_HASBG;                  // There is now a color.
      _value &= ~_COLOR_BG;                    // Remove previous color.
      _value |= (c._value & _COLOR_BG);        // Apply other color.
    }
  }
#endif
}